

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O3

void __thiscall
SamplerTest_bytes_until_sample_Overflow_Underflow_Test::TestBody
          (SamplerTest_bytes_until_sample_Overflow_Underflow_Test *this)

{
  long lVar1;
  ulong uVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *pcVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auStack_d8 [8];
  Sampler sampler;
  uint64_t sample_parameter_array [4];
  ulong local_78;
  uint64_t smallest_sample_step;
  uint64_t cutoff;
  uint64_t largest_sample_step;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  auStack_d8 = (undefined1  [8])0x0;
  sampler.bytes_until_sample_ = 0;
  sampler.rnd_._0_1_ = 0;
  tcmalloc::Sampler::Init((Sampler *)auStack_d8,1);
  sample_parameter_array[0] = 1;
  sample_parameter_array[1] = 0x80000;
  sample_parameter_array[2] = 0x400000000000000;
  lVar1 = 0;
  while( true ) {
    uVar2 = sample_parameter_array[lVar1 + -1];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"sample_parameter = ",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    auVar6._8_4_ = (int)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    sample_parameter_array[3] =
         (uint64_t)
         (((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * -0.6931471805599453);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    StringPrintf_abi_cxx11_((string *)local_58,"q = %f\n",0x4190000000000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT71(local_58._1_7_,local_58[0]),(long)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    StringPrintf_abi_cxx11_((string *)local_58,"log2(q) = %f\n",0x403a000000000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT71(local_58._1_7_,local_58[0]),(long)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
    }
    dVar5 = (double)sample_parameter_array[3] * 0.0 + 1.0;
    local_78 = (ulong)dVar5;
    local_78 = (long)(dVar5 - 9.223372036854776e+18) & (long)local_78 >> 0x3f | local_78;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Smallest sample step is ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    smallest_sample_step = (uVar2 >> 0x18) * 10 + 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Acceptable value is < ",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_58,"smallest_sample_step","cutoff",&local_78,&smallest_sample_step)
    ;
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&cutoff);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,0x186,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&cutoff);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      _Var3._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)cutoff;
      goto LAB_0010c601;
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    StringPrintf_abi_cxx11_((string *)local_58,"q = %f\n",0x3ff0000000000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT71(local_58._1_7_,local_58[0]),(long)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
    }
    dVar5 = (double)sample_parameter_array[3] * -26.0 + 1.0;
    uVar2 = (ulong)dVar5;
    cutoff = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Largest sample step is ",0x17);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x8000000000000000;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_58,"largest_sample_step","one<<63",&cutoff,
               (unsigned_long *)&local_38);
    if (local_58[0] == (internal)0x0) break;
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
              ((internal *)local_58,"largest_sample_step","smallest_sample_step",&cutoff,&local_78);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&largest_sample_step,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
                 ,0x191,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&largest_sample_step,(Message *)&local_38);
      goto LAB_0010c5f4;
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    lVar1 = lVar1 + 1;
    if (lVar1 == 4) {
      return;
    }
  }
  testing::Message::Message((Message *)&local_38);
  if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = (local_50->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&largest_sample_step,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampler_test.cc"
             ,400,pcVar4);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&largest_sample_step,(Message *)&local_38);
LAB_0010c5f4:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&largest_sample_step);
  _Var3._M_head_impl = local_38._M_head_impl;
LAB_0010c601:
  if (_Var3._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
  if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,local_50);
  return;
}

Assistant:

TEST_F(SamplerTest, bytes_until_sample_Overflow_Underflow) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  uint64_t one = 1;
  // sample_parameter = 0;  // To test the edge case
  uint64_t sample_parameter_array[4] = {0, 1, one<<19, one<<58};
  for (int i = 0; i < 4; i++) {
    uint64_t sample_parameter = sample_parameter_array[i];
    LOG(INFO) << "sample_parameter = " << sample_parameter;
    double sample_scaling = - log(2.0) * sample_parameter;
    // Take the top 26 bits as the random number
    // (This plus the 1<<26 sampling bound give a max step possible of
    // 1209424308 bytes.)
    const uint64_t prng_mod_power = 48;  // Number of bits in prng

    // First, check the largest_prng value
    uint64_t largest_prng_value = (static_cast<uint64_t>(1)<<48) - 1;
    double q = (largest_prng_value >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << StringPrintf("q = %f\n", q);
    LOG(INFO) << StringPrintf("log2(q) = %f\n", log(q)/log(2.0));
    uint64_t smallest_sample_step
      = static_cast<uint64_t>(std::min(log2(q) - 26, 0.0)
                              * sample_scaling + 1);
    LOG(INFO) << "Smallest sample step is " << smallest_sample_step;
    uint64_t cutoff = static_cast<uint64_t>(10)
                      * (sample_parameter/(one<<24) + 1);
    LOG(INFO) << "Acceptable value is < " << cutoff;
    // This checks that the answer is "small" and positive
    ASSERT_LE(smallest_sample_step, cutoff);

    // Next, check with the smallest prng value
    uint64_t smallest_prng_value = 0;
    q = (smallest_prng_value >> (prng_mod_power - 26)) + 1.0;
    LOG(INFO) << StringPrintf("q = %f\n", q);
    uint64_t largest_sample_step
      = static_cast<uint64_t>(std::min(log2(q) - 26, 0.0)
                              * sample_scaling + 1);
    LOG(INFO) << "Largest sample step is " << largest_sample_step;
    ASSERT_LE(largest_sample_step, one<<63);
    ASSERT_GE(largest_sample_step, smallest_sample_step);
  }
}